

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<int>::Subst_LBackward(TPZMatrix<int> *this,TPZFMatrix<int> *B)

{
  long lVar1;
  TPZBaseMatrix *pTVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  long lVar6;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  int sum;
  int64_t c;
  int64_t r;
  char *in_stack_00000188;
  char *in_stack_00000190;
  int local_34;
  long local_30;
  int local_24;
  long local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar5 = TPZBaseMatrix::Rows(in_RSI);
  lVar6 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar5 != lVar6) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] != '\x04')) {
    Error(in_stack_00000190,in_stack_00000188);
  }
  local_18 = (**(code **)(*in_RDI + 0x60))();
  while (local_18 = local_18 + -1, -1 < local_18) {
    for (local_20 = 0; lVar6 = local_20, iVar5 = TPZBaseMatrix::Cols(local_10), lVar6 < iVar5;
        local_20 = local_20 + 1) {
      local_24 = 0;
      local_30 = (**(code **)(*in_RDI + 0x60))();
      while (pTVar2 = local_10, lVar1 = local_18, lVar6 = local_20, local_30 = local_30 + -1,
            local_18 < local_30) {
        iVar3 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_18,local_30);
        iVar4 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_30,local_20);
        local_24 = iVar3 * iVar4 + local_24;
      }
      local_34 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_18,local_20);
      local_34 = local_34 - local_24;
      (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar2,lVar1,lVar6,&local_34);
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}